

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O1

bool __thiscall
chrono::ChArchiveExplorer::FetchValue<myEmployeeBoss,myEmployee>
          (ChArchiveExplorer *this,myEmployee *val,myEmployeeBoss *root,string *property_name)

{
  char *__s1;
  double dVar1;
  undefined4 uVar2;
  int iVar3;
  undefined4 extraout_var;
  myEmployee *pmVar4;
  undefined4 extraout_var_00;
  bool bVar5;
  ChNameValue<myEmployeeBoss> local_30;
  
  PrepareSearch(this,property_name);
  local_30._name = "";
  local_30._flags = '\0';
  local_30._value = root;
  ChArchiveOut::out<myEmployeeBoss>(&this->super_ChArchiveOut,&local_30);
  if (this->found == true) {
    iVar3 = (*(*(this->results).
                super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                super__Vector_impl_data._M_start)->_vptr_ChValue[6])();
    __s1 = *(char **)(CONCAT44(extraout_var,iVar3) + 8);
    if ((__s1 == "10myEmployee") ||
       ((*__s1 != '*' && (iVar3 = strcmp(__s1,"10myEmployee"), iVar3 == 0)))) {
      iVar3 = (*(*(this->results).
                  super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>._M_impl.
                  super__Vector_impl_data._M_start)->_vptr_ChValue[0xc])();
      pmVar4 = (myEmployee *)CONCAT44(extraout_var_00,iVar3);
    }
    else {
      pmVar4 = ChValue::PointerUpCast<myEmployee>
                         (*(this->results).
                           super__Vector_base<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>
                           ._M_impl.super__Vector_impl_data._M_start);
      if (pmVar4 == (myEmployee *)0x0) {
        return pmVar4 != (myEmployee *)0x0;
      }
    }
    val->body = pmVar4->body;
    uVar2 = *(undefined4 *)&pmVar4->field_0xc;
    dVar1 = pmVar4->wages;
    val->age = pmVar4->age;
    *(undefined4 *)&val->field_0xc = uVar2;
    val->wages = dVar1;
    std::__cxx11::string::_M_assign((string *)&val->name);
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool FetchValue(P& val, const T& root, const std::string& property_name) {

          this->PrepareSearch(property_name);
          
          this->operator<<( CHNVP(root,"") ); // SCAN! 

          if (found) {
              if (*this->results[0]->GetTypeid() == typeid(P)) { 
                  val = *(static_cast<P*> (this->results[0]->GetRawPtr()));
                  return true;
              }
              else if (P* valptr = this->results[0]->PointerUpCast<P>()) {
                  val = *valptr;
                  return true;
              } else
                  return false;
          }
          else
              return false;
      }